

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

bool tcu::astc::isValidBlock(deUint8 *data,CompressedTexFormat format,AstcMode mode)

{
  bool bVar1;
  bool isSRGB;
  DecompressResult DVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  IVec3 blockPixelSize;
  Block128 blockData;
  anon_union_2304_2_1776bc36 tmpBuffer;
  int local_934;
  int local_930;
  Block128 local_928;
  undefined1 local_918 [2304];
  
  getBlockPixelSize((tcu *)&local_934,format);
  isSRGB = isAstcSRGBFormat(format);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    pbVar6 = data + lVar5;
    lVar3 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 | (ulong)*pbVar6 << ((byte)lVar3 & 0x3f);
      lVar3 = lVar3 + 8;
      pbVar6 = pbVar6 + 1;
    } while (lVar3 != 0x40);
    *(ulong *)((long)local_928.m_words + lVar5) = uVar7;
    lVar5 = 8;
    bVar1 = false;
  } while (bVar4);
  DVar2 = anon_unknown_0::decompressBlock
                    (local_918,&local_928,local_934,local_930,isSRGB,mode == ASTCMODE_LDR || isSRGB)
  ;
  return DVar2 == DECOMPRESS_RESULT_VALID_BLOCK;
}

Assistant:

bool isValidBlock (const deUint8* data, CompressedTexFormat format, TexDecompressionParams::AstcMode mode)
{
	const tcu::IVec3		blockPixelSize	= getBlockPixelSize(format);
	const bool				isSRGB			= isAstcSRGBFormat(format);
	const bool				isLDR			= isSRGB || mode == TexDecompressionParams::ASTCMODE_LDR;

	// sRGB is not supported in HDR mode
	DE_ASSERT(!(mode == TexDecompressionParams::ASTCMODE_HDR && isSRGB));

	union
	{
		deUint8		sRGB[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
		float		linear[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
	} tmpBuffer;
	const Block128			blockData		(data);
	const DecompressResult	result			= decompressBlock((isSRGB ? (void*)&tmpBuffer.sRGB[0] : (void*)&tmpBuffer.linear[0]),
															  blockData, blockPixelSize.x(), blockPixelSize.y(), isSRGB, isLDR);

	return result == DECOMPRESS_RESULT_VALID_BLOCK;
}